

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas_factory.h
# Opt level: O0

void __thiscall
linux_util::canvas_factory<(linux_util::screen_t)0>::initialize
          (canvas_factory<(linux_util::screen_t)0> *this)

{
  uint uVar1;
  fildes_t __fd;
  void *pvVar2;
  device *in_RDI;
  void *in_stack_00000060;
  request_t in_stack_00000068;
  device *in_stack_00000070;
  
  device::xioctl(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  memcpy(&in_RDI[4].ERR.field_0x4,&in_RDI[2].ERR.field_0x4,0xa0);
  *(int *)&in_RDI[2].ERR.field_0x4 = (int)*(undefined8 *)((long)&in_RDI[1].ERR.field_2 + 8);
  *(int *)&in_RDI[2].ERR._M_string_length = (int)*(undefined8 *)&in_RDI[1].device_path;
  *(int *)&in_RDI[2]._vptr_device = (int)in_RDI[2].ERR._M_string_length;
  *(int *)((long)&in_RDI[2]._vptr_device + 4) =
       *(int *)&in_RDI[2]._vptr_device + (int)in_RDI[2].ERR._M_string_length;
  *(undefined4 *)((long)&in_RDI[2].ERR._M_string_length + 4) =
       *(undefined4 *)&in_RDI[2].ERR.field_0x4;
  *(int *)&in_RDI[2].ERR.field_2 = (int)in_RDI[2].ERR._M_string_length * 3;
  *(undefined4 *)((long)&in_RDI[2].ERR.field_2 + 8) =
       *(undefined4 *)((long)&in_RDI[2]._vptr_device + 4);
  *(undefined4 *)&in_RDI[2].device_path = 0;
  *(undefined4 *)((long)&in_RDI[2].ERR.field_2 + 0xc) = *(undefined4 *)&in_RDI->field_0x4c;
  *(undefined4 *)&in_RDI[3].ERR._M_string_length = 0x10;
  device::xioctl(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  device::xioctl(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  device::xioctl(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  *(int *)&in_RDI[1].device_path._M_string_length =
       (int)in_RDI[2].ERR._M_string_length * *(int *)((long)&in_RDI[6].device_path.field_2 + 8);
  uVar1 = *(uint *)&in_RDI[6].device_path;
  __fd = device::fildes(in_RDI);
  pvVar2 = mmap((void *)0x0,(ulong)uVar1,3,1,__fd,0);
  in_RDI[1].device_path.field_2._M_allocated_capacity = (size_type)pvVar2;
  *(size_type *)((long)&in_RDI[1].device_path.field_2 + 8) =
       in_RDI[1].device_path.field_2._M_allocated_capacity +
       (ulong)(uint)in_RDI[1].device_path._M_string_length;
  *(ulong *)&in_RDI[1].fd =
       *(long *)((long)&in_RDI[1].device_path.field_2 + 8) +
       (ulong)(uint)in_RDI[1].device_path._M_string_length;
  return;
}

Assistant:

void initialize() override final {
            xioctl(FBIOGET_VSCREENINFO, &vinfo); // acquire variable info
            memcpy(&vinfo_old, &vinfo, sizeof(struct fb_var_screeninfo)); // copy current info for restore
            vinfo.xres = width;
            vinfo.yres = height;
            screen1_yoffset = vinfo.yres;
            screen2_yoffset = screen1_yoffset + vinfo.yres;
            vinfo.xres_virtual = vinfo.xres;
            vinfo.yres_virtual = vinfo.yres * 3; //make space for 2 virtual screens
            vinfo.yoffset = screen2_yoffset; //so the first swap works correctly
            vinfo.grayscale = 0; // ensure colour
            vinfo.bits_per_pixel = DEFAULT_BPP;
            vinfo.activate = FB_ACTIVATE_VBL;
            xioctl(FBIOPUT_VSCREENINFO, &vinfo); // write new vinfo
            xioctl(FBIOGET_VSCREENINFO, &vinfo); // re-acquire variable info
            xioctl(FBIOGET_FSCREENINFO, &finfo); // acquire fixed info
            screensize = vinfo.yres * finfo.line_length; // size of visible area
            //memory map entire frame buffer of 3 x "screens"
            screen0 = static_cast<uint8_t *>(mmap(0, finfo.smem_len, PROT_READ | PROT_WRITE, MAP_SHARED, device::fildes(), (off_t)0));
            screen1 = screen0 + screensize; // offset each of the virtual screens
            screen2 = screen1 + screensize;

        }